

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O3

void ncnn::transpose(Mat *X,Mat *XT,Option *opt)

{
  uint uVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  lVar2 = (long)X->w;
  if (0 < lVar2) {
    puVar3 = (undefined4 *)X->data;
    uVar1 = X->h;
    lVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        puVar5 = puVar3;
        do {
          *(undefined4 *)((long)&XT->data + uVar6 * 4) = *puVar5;
          uVar6 = uVar6 + 1;
          puVar5 = puVar5 + lVar2;
        } while (uVar1 != uVar6);
      }
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 1;
      XT = (Mat *)((long)&XT->data + (long)(int)uVar1 * 4);
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

static void transpose(const Mat& X, Mat& XT, const Option& opt)
{
    const int w = X.w;
    const int h = X.h;

    const float* pX = X;
    float* pXT = XT;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < w; i++)
    {
        float* ptr = pXT + i * h;
        for (int j = 0; j < h; j++)
        {
            ptr[j] = pX[j * w + i];
        }
    }
}